

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageFieldGenerator::GenerateBuildingCode
          (ImmutableLazyMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_ImmutableMessageFieldGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "if ($get_has_field_bit_from_local$) {\n  $set_has_field_bit_to_local$;\n}\n");
  io::Printer::Print(printer,variables,"result.$name$_.set(\n    $name$_);\n");
  return;
}

Assistant:

void ImmutableLazyMessageFieldGenerator::
GenerateBuildingCode(io::Printer* printer) const {
  printer->Print(variables_,
      "if ($get_has_field_bit_from_local$) {\n"
      "  $set_has_field_bit_to_local$;\n"
      "}\n");

  printer->Print(variables_,
      "result.$name$_.set(\n"
      "    $name$_);\n");
}